

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::~RepeatedField(RepeatedField<unsigned_long> *this)

{
  unsigned_long *puVar1;
  void **ppvVar2;
  
  if (this->total_size_ == 0) {
    ppvVar2 = &this->arena_or_elements_;
  }
  else {
    puVar1 = elements(this);
    ppvVar2 = (void **)(puVar1 + -1);
  }
  if ((ThreadSafeArena *)*ppvVar2 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)*ppvVar2);
  }
  if (0 < this->total_size_) {
    puVar1 = elements(this);
    if (puVar1[-1] == 0) {
      operator_delete(puVar1 + -1);
      return;
    }
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds. If arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena();
  if (arena) (void)arena->SpaceAllocated();
#endif
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}